

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O0

void __thiscall ODDLParser::Value::setString(Value *this,string *str)

{
  uchar *puVar1;
  void *__src;
  size_t __n;
  long lVar2;
  string *str_local;
  Value *this_local;
  
  if (this->m_type == ddl_string) {
    puVar1 = this->m_data;
    __src = (void *)std::__cxx11::string::c_str();
    __n = std::__cxx11::string::size();
    memcpy(puVar1,__src,__n);
    puVar1 = this->m_data;
    lVar2 = std::__cxx11::string::size();
    puVar1[lVar2] = '\0';
    return;
  }
  __assert_fail("ddl_string == m_type",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/contrib/openddlparser/code/Value.cpp"
                ,0x10a,"void ODDLParser::Value::setString(const std::string &)");
}

Assistant:

void Value::setString( const std::string &str ) {
    assert( ddl_string == m_type );
    ::memcpy( m_data, str.c_str(), str.size() );
    m_data[ str.size() ] = '\0';
}